

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

int xmlParserEntityCheck(xmlParserCtxtPtr ctxt,unsigned_long extra)

{
  xmlParserInputPtr pxVar1;
  xmlEntityPtr pxVar2;
  xmlEntityPtr entity;
  xmlParserInputPtr input;
  unsigned_long *expandedSize;
  unsigned_long consumed;
  unsigned_long extra_local;
  xmlParserCtxtPtr ctxt_local;
  
  pxVar1 = ctxt->input;
  pxVar2 = pxVar1->entity;
  if ((pxVar2 == (xmlEntityPtr)0x0) || ((pxVar2->flags & 2U) == 0)) {
    expandedSize = (unsigned_long *)pxVar1->consumed;
    consumed = extra;
    extra_local = (unsigned_long)ctxt;
    xmlSaturatedAddSizeT((unsigned_long *)&expandedSize,(long)pxVar1->cur - (long)pxVar1->base);
    xmlSaturatedAdd((unsigned_long *)&expandedSize,*(unsigned_long *)(extra_local + 0x2c0));
    if (pxVar2 == (xmlEntityPtr)0x0) {
      input = (xmlParserInputPtr)(extra_local + 0x2e8);
    }
    else {
      input = (xmlParserInputPtr)&pxVar2->expandedSize;
    }
    xmlSaturatedAdd((unsigned_long *)input,consumed);
    xmlSaturatedAdd((unsigned_long *)input,0x14);
    if ((input->buf < (xmlParserInputBufferPtr)0xf4241) ||
       ((input->buf != (xmlParserInputBufferPtr)0xffffffffffffffff &&
        ((unsigned_long *)((ulong)input->buf / (ulong)*(uint *)(extra_local + 0x2f8)) <=
         expandedSize)))) {
      ctxt_local._4_4_ = 0;
    }
    else {
      xmlFatalErrMsg((xmlParserCtxtPtr)extra_local,XML_ERR_RESOURCE_LIMIT,
                     "Maximum entity amplification factor exceeded, see xmlCtxtSetMaxAmplification.\n"
                    );
      xmlHaltParser((xmlParserCtxtPtr)extra_local);
      ctxt_local._4_4_ = 1;
    }
  }
  else {
    ctxt_local._4_4_ = 0;
  }
  return ctxt_local._4_4_;
}

Assistant:

static int
xmlParserEntityCheck(xmlParserCtxtPtr ctxt, unsigned long extra)
{
    unsigned long consumed;
    unsigned long *expandedSize;
    xmlParserInputPtr input = ctxt->input;
    xmlEntityPtr entity = input->entity;

    if ((entity) && (entity->flags & XML_ENT_CHECKED))
        return(0);

    /*
     * Compute total consumed bytes so far, including input streams of
     * external entities.
     */
    consumed = input->consumed;
    xmlSaturatedAddSizeT(&consumed, input->cur - input->base);
    xmlSaturatedAdd(&consumed, ctxt->sizeentities);

    if (entity)
        expandedSize = &entity->expandedSize;
    else
        expandedSize = &ctxt->sizeentcopy;

    /*
     * Add extra cost and some fixed cost.
     */
    xmlSaturatedAdd(expandedSize, extra);
    xmlSaturatedAdd(expandedSize, XML_ENT_FIXED_COST);

    /*
     * It's important to always use saturation arithmetic when tracking
     * entity sizes to make the size checks reliable. If "sizeentcopy"
     * overflows, we have to abort.
     */
    if ((*expandedSize > XML_PARSER_ALLOWED_EXPANSION) &&
        ((*expandedSize >= ULONG_MAX) ||
         (*expandedSize / ctxt->maxAmpl > consumed))) {
        xmlFatalErrMsg(ctxt, XML_ERR_RESOURCE_LIMIT,
                       "Maximum entity amplification factor exceeded, see "
                       "xmlCtxtSetMaxAmplification.\n");
        xmlHaltParser(ctxt);
        return(1);
    }

    return(0);
}